

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidget::restoreGeometry(QWidget *this,QByteArray *geometry)

{
  bool bVar1;
  int iVar2;
  QFlagsStorage<Qt::WindowState> QVar3;
  qsizetype qVar4;
  QDataStream *pQVar5;
  QRect *this_00;
  QRect *this_01;
  QSize *this_02;
  QStyle *pQVar6;
  QTLWExtra *pQVar7;
  QByteArray *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *this_03;
  int frameHeight;
  qreal factor;
  qreal screenWidthF;
  QScreen *restoredScreen;
  quint16 currentMajorVersion;
  quint32 magicNumber;
  WindowStates ws;
  QRect availableGeometry;
  qint32 restoredScreenWidth;
  quint8 fullScreen;
  quint8 maximized;
  qint32 restoredScreenNumber;
  QRect restoredNormalGeometry;
  QRect restoredGeometry;
  QRect restoredFrameGeometry;
  quint16 minorVersion;
  quint16 majorVersion;
  quint32 storedMagicNumber;
  QDataStream stream;
  int in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  QRect *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffea0;
  int iVar8;
  QWidget *in_stack_fffffffffffffea8;
  QWidgetPrivate *pQVar9;
  QFlagsStorage<Qt::WindowState> newstate;
  QSize *pQVar10;
  undefined6 in_stack_fffffffffffffec0;
  undefined2 uVar11;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 uVar12;
  bool local_119;
  QFlagsStorage<Qt::WindowState> local_10c;
  undefined1 local_108 [16];
  QSize local_f8;
  QSize local_f0;
  QSize local_e8;
  undefined8 local_e0;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [16];
  int local_94;
  QList<QScreen_*> local_90;
  qsizetype local_78;
  int local_6c;
  char local_66;
  char local_65;
  int local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined2 local_30;
  ushort local_2e;
  int local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar4 = QByteArray::size(in_RSI);
  if (qVar4 < 4) {
    local_119 = false;
    goto LAB_003774d9;
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_28,in_RSI);
  QDataStream::setVersion((QDataStream *)&local_28,7);
  uVar12 = 0x1d9d0cb;
  local_2c = -0x55555556;
  QDataStream::operator>>
            ((QDataStream *)in_stack_fffffffffffffe70,
             (quint32 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (local_2c == 0x1d9d0cb) {
    uVar11 = 3;
    local_2e = 0;
    local_30 = 0;
    QDataStream::operator>>
              ((QDataStream *)in_stack_fffffffffffffe70,
               (quint16 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    QDataStream::operator>>
              ((QDataStream *)in_stack_fffffffffffffe70,
               (quint16 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (local_2e < 4) {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      QRect::QRect(in_stack_fffffffffffffe70);
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QRect::QRect(in_stack_fffffffffffffe70);
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QRect::QRect(in_stack_fffffffffffffe70);
      local_64 = -0x55555556;
      local_65 = -0x56;
      local_66 = -0x56;
      local_6c = 0;
      pQVar5 = (QDataStream *)::operator>>((QDataStream *)&local_28,(QRect *)&local_40);
      pQVar5 = (QDataStream *)::operator>>(pQVar5,(QRect *)&local_60);
      QDataStream::operator>>(pQVar5,&local_64);
      QDataStream::operator>>
                ((QDataStream *)in_stack_fffffffffffffe70,
                 (quint8 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QDataStream::operator>>
                ((QDataStream *)in_stack_fffffffffffffe70,
                 (quint8 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      if (1 < local_2e) {
        QDataStream::operator>>((QDataStream *)&local_28,&local_6c);
      }
      if (2 < local_2e) {
        ::operator>>((QDataStream *)&local_28,(QRect *)&local_50);
      }
      this_00 = (QRect *)(long)local_64;
      QGuiApplication::screens();
      local_78 = QList<QScreen_*>::size(&local_90);
      local_94 = 1;
      this_01 = (QRect *)qMax<long_long,int>(&local_78,&local_94);
      QList<QScreen_*>::~QList((QList<QScreen_*> *)0x377061);
      if ((long)this_01 <= (long)this_00) {
        local_64 = 0;
      }
      QGuiApplication::screens();
      this_02 = (QSize *)QList<QScreen_*>::value
                                   ((QList<QScreen_*> *)in_RDI,(qsizetype)this_00,
                                    (parameter_type)this_01);
      QList<QScreen_*>::~QList((QList<QScreen_*> *)0x3770b3);
      pQVar10 = this_02;
      if (this_02 == (QSize *)0x0) {
        this_03 = (QWidgetPrivate *)0x0;
      }
      else {
        local_c0 = QScreen::geometry();
        iVar2 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
        ;
        this_03 = (QWidgetPrivate *)(double)iVar2;
      }
      pQVar9 = this_03;
      if (local_6c == 0) {
        if ((local_65 == '\0') && (local_66 == '\0')) {
          iVar2 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ));
          if (1.5 < (double)iVar2 / (double)pQVar9) {
            local_119 = false;
            goto LAB_003774cc;
          }
        }
      }
      else {
        in_stack_fffffffffffffea8 = (QWidget *)((double)local_6c / (double)this_03);
        if (((double)in_stack_fffffffffffffea8 < 0.8) || (1.25 < (double)in_stack_fffffffffffffea8))
        {
          local_119 = false;
          goto LAB_003774cc;
        }
      }
      newstate.i = (Int)((ulong)pQVar9 >> 0x20);
      pQVar6 = QApplication::style();
      if (pQVar6 == (QStyle *)0x0) {
        iVar2 = 0x14;
      }
      else {
        pQVar6 = QApplication::style();
        iVar2 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x1a,0,in_RDI);
      }
      iVar8 = iVar2;
      bVar1 = QRect::isValid((QRect *)this_03);
      if (!bVar1) {
        QPoint::QPoint((QPoint *)this_03,iVar2,in_stack_fffffffffffffe68);
        local_e0 = (**(code **)(*(long *)in_RDI + 0x70))();
        QRect::QRect((QRect *)in_RDI,(QPoint *)this_00,(QSize *)this_01);
        local_60 = local_d0;
        local_58 = local_c8;
      }
      bVar1 = QRect::isValid((QRect *)this_03);
      if (!bVar1) {
        local_f0 = QRect::size(this_01);
        d_func((QWidget *)0x377298);
        local_f8 = QWidgetPrivate::adjustedSize
                             ((QWidgetPrivate *)CONCAT44(iVar8,in_stack_fffffffffffffea0));
        local_e8 = QSize::expandedTo(this_02,(QSize *)this_03);
        QRect::setSize(this_00,(QSize *)this_01);
      }
      QVar3.i = (Int)this_02;
      local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      if (pQVar10 == (QSize *)0x0) {
        QRect::QRect((QRect *)this_03);
        iVar2 = (int)((ulong)pQVar10 >> 0x20);
      }
      else {
        local_108 = QScreen::availableGeometry();
        iVar2 = (int)((ulong)pQVar10 >> 0x20);
      }
      QWidgetPrivate::checkRestoredGeometry
                ((QRect *)CONCAT44(uVar12,in_stack_fffffffffffffec8),
                 (QRect *)CONCAT26(uVar11,in_stack_fffffffffffffec0),iVar2);
      QWidgetPrivate::checkRestoredGeometry
                ((QRect *)CONCAT44(uVar12,in_stack_fffffffffffffec8),
                 (QRect *)CONCAT26(uVar11,in_stack_fffffffffffffec0),iVar2);
      if ((local_65 == '\0') && (local_66 == '\0')) {
        windowState((QWidget *)this_03);
        Qt::operator|((enum_type)((ulong)this_03 >> 0x20),(enum_type)this_03);
        QFlags<Qt::WindowState>::operator~((QFlags<Qt::WindowState> *)this_03);
        QVar3.i = (Int)QFlags<Qt::WindowState>::operator&
                                 ((QFlags<Qt::WindowState> *)this_03,QVar3.i);
        setWindowState(in_RDI,(WindowStates)newstate.i);
        if (local_2e < 3) {
          setGeometry(in_stack_fffffffffffffea8,(QRect *)CONCAT44(iVar8,QVar3.i));
        }
        else {
          setGeometry(in_stack_fffffffffffffea8,(QRect *)CONCAT44(iVar8,QVar3.i));
        }
      }
      else {
        local_10c.i = 0xaaaaaaaa;
        local_10c.i = (Int)windowState((QWidget *)this_03);
        setGeometry(in_stack_fffffffffffffea8,(QRect *)CONCAT44(iVar8,in_stack_fffffffffffffea0));
        if (local_65 != '\0') {
          QFlags<Qt::WindowState>::operator|=((QFlags<Qt::WindowState> *)&local_10c,WindowMaximized)
          ;
        }
        if (local_66 != '\0') {
          QFlags<Qt::WindowState>::operator|=
                    ((QFlags<Qt::WindowState> *)&local_10c,WindowFullScreen);
        }
        setWindowState(in_RDI,(WindowStates)newstate.i);
        d_func((QWidget *)0x377404);
        pQVar7 = QWidgetPrivate::topData(this_03);
        *(undefined1 **)&pQVar7->normalGeometry = local_60;
        *(undefined1 **)&(pQVar7->normalGeometry).x2 = local_58;
      }
      local_119 = true;
    }
    else {
      local_119 = false;
    }
  }
  else {
    local_119 = false;
  }
LAB_003774cc:
  QDataStream::~QDataStream((QDataStream *)&local_28);
LAB_003774d9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_119;
}

Assistant:

bool QWidget::restoreGeometry(const QByteArray &geometry)
{
    if (geometry.size() < 4)
        return false;
    QDataStream stream(geometry);
    stream.setVersion(QDataStream::Qt_4_0);

    const quint32 magicNumber = 0x1D9D0CB;
    quint32 storedMagicNumber;
    stream >> storedMagicNumber;
    if (storedMagicNumber != magicNumber)
        return false;

    const quint16 currentMajorVersion = 3;
    quint16 majorVersion = 0;
    quint16 minorVersion = 0;

    stream >> majorVersion >> minorVersion;

    if (majorVersion > currentMajorVersion)
        return false;
    // (Allow all minor versions.)

    QRect restoredFrameGeometry;
    QRect restoredGeometry;
    QRect restoredNormalGeometry;
    qint32 restoredScreenNumber;
    quint8 maximized;
    quint8 fullScreen;
    qint32 restoredScreenWidth = 0;

    stream >> restoredFrameGeometry // Only used for sanity checks in version 0
           >> restoredNormalGeometry
           >> restoredScreenNumber
           >> maximized
           >> fullScreen;

    if (majorVersion > 1)
        stream >> restoredScreenWidth;
    if (majorVersion > 2)
        stream >> restoredGeometry;

    // ### Qt 6 - Perhaps it makes sense to dumb down the restoreGeometry() logic, see QTBUG-69104

    if (restoredScreenNumber >= qMax(QGuiApplication::screens().size(), 1))
        restoredScreenNumber = 0;
    const QScreen *restoredScreen = QGuiApplication::screens().value(restoredScreenNumber, nullptr);
    const qreal screenWidthF = restoredScreen ? qreal(restoredScreen->geometry().width()) : 0;
    // Sanity check bailing out when large variations of screen sizes occur due to
    // high DPI scaling or different levels of DPI awareness.
    if (restoredScreenWidth) {
        const qreal factor = qreal(restoredScreenWidth) / screenWidthF;
        if (factor < 0.8 || factor > 1.25)
            return false;
    } else {
        // Saved by Qt 5.3 and earlier, try to prevent too large windows
        // unless the size will be adapted by maximized or fullscreen.
        if (!maximized && !fullScreen && qreal(restoredFrameGeometry.width()) / screenWidthF > 1.5)
            return false;
    }

    const int frameHeight = QApplication::style()
                          ? QApplication::style()->pixelMetric(QStyle::PM_TitleBarHeight, nullptr, this)
                          : 20;

    if (!restoredNormalGeometry.isValid())
        restoredNormalGeometry = QRect(QPoint(0, frameHeight), sizeHint());
    if (!restoredNormalGeometry.isValid()) {
        // use the widget's adjustedSize if the sizeHint() doesn't help
        restoredNormalGeometry.setSize(restoredNormalGeometry
                                       .size()
                                       .expandedTo(d_func()->adjustedSize()));
    }

    const QRect availableGeometry = restoredScreen ? restoredScreen->availableGeometry()
                                                   : QRect();

    // Modify the restored geometry if we are about to restore to coordinates
    // that would make the window "lost". This happens if:
    // - The restored geometry is completely or partly oustside the available geometry
    // - The title bar is outside the available geometry.

    QWidgetPrivate::checkRestoredGeometry(availableGeometry, &restoredGeometry, frameHeight);
    QWidgetPrivate::checkRestoredGeometry(availableGeometry, &restoredNormalGeometry, frameHeight);

    if (maximized || fullScreen) {
        // set geometry before setting the window state to make
        // sure the window is maximized to the right screen.
        Qt::WindowStates ws = windowState();
#ifndef Q_OS_WIN
        setGeometry(restoredNormalGeometry);
#else
        if (ws & Qt::WindowFullScreen) {
            // Full screen is not a real window state on Windows.
            move(availableGeometry.topLeft());
        } else if (ws & Qt::WindowMaximized) {
            // Setting a geometry on an already maximized window causes this to be
            // restored into a broken, half-maximized state, non-resizable state (QTBUG-4397).
            // Move the window in normal state if needed.
            if (restoredScreen != screen()) {
                setWindowState(Qt::WindowNoState);
                setGeometry(restoredNormalGeometry);
            }
        } else {
            setGeometry(restoredNormalGeometry);
        }
#endif // Q_OS_WIN
        if (maximized)
            ws |= Qt::WindowMaximized;
        if (fullScreen)
            ws |= Qt::WindowFullScreen;
       setWindowState(ws);
       d_func()->topData()->normalGeometry = restoredNormalGeometry;
    } else {
        setWindowState(windowState() & ~(Qt::WindowMaximized | Qt::WindowFullScreen));

        // FIXME: Why fall back to restoredNormalGeometry if majorVersion <= 2?
        if (majorVersion > 2)
            setGeometry(restoredGeometry);
        else
            setGeometry(restoredNormalGeometry);
    }
    return true;
}